

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_state.cpp
# Opt level: O2

int (anonymous_namespace)::store_int<int,char>(int *out,char *val,int min,int max)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  
  piVar2 = __errno_location();
  *piVar2 = 0;
  lVar3 = anon_unknown.dwarf_a9c0::to_long(val);
  if ((lVar3 == 0) && (*piVar2 != 0)) {
    iVar1 = 3;
  }
  else if ((long)(ulong)(uint)max < lVar3 || lVar3 < (long)(ulong)(uint)min) {
    iVar1 = 2;
  }
  else {
    *out = (int)lVar3;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int store_int(INT_T *out, const CHAR_T *val, INT_T min, INT_T max)
{
    errno = 0;
    long val_as_long = to_long(val);
    if (val_as_long == 0 && errno != 0)
        return __CILKRTS_SET_PARAM_INVALID;
    if (val_as_long < min || val_as_long == LONG_MIN)
        return __CILKRTS_SET_PARAM_XRANGE;
    else if (val_as_long > max || val_as_long == LONG_MAX)
        return __CILKRTS_SET_PARAM_XRANGE;

    *out = val_as_long;
    return __CILKRTS_SET_PARAM_SUCCESS;
}